

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderAtomicOpCase::init(ShaderAtomicOpCase *this,EVP_PKEY_CTX *ctx)

{
  AtomicOperandType AVar1;
  DataType DVar2;
  RenderContext *renderCtx;
  DataType DVar3;
  ContextType type;
  GLSLVersion version;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  long *plVar9;
  ShaderProgram *pSVar10;
  TestError *this_00;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  bool *pbVar13;
  ulong uVar14;
  string castBeg;
  ostringstream src;
  undefined1 auStack_308 [8];
  DataType local_300;
  allocator<char> local_2f9;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  long *local_2e0;
  long local_2d8;
  long local_2d0 [2];
  Hex<8UL> local_2c0;
  value_type local_2b8;
  long *local_298 [2];
  long local_288 [2];
  undefined1 local_278 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1e8;
  undefined1 local_1c8 [32];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  AVar1 = this->m_operandType;
  pcVar5 = glu::getPrecisionName(this->m_precision);
  local_2f8 = glu::getDataTypeName(this->m_type);
  local_300 = TYPE_UINT;
  if (AVar1 == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    local_300 = this->m_type;
  }
  local_2f0 = glu::getDataTypeName(local_300);
  lVar11 = 0;
  do {
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  lVar11 = 0;
  do {
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  pcVar6 = glu::getGLSLVersionDeclaration(version);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)auStack_308 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x160);
  }
  else {
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(local_size_x = ",0x16);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", local_size_y = ",0x11);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", local_size_z = ",0x11);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(binding = 0) buffer InOut\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t",1);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar8 + -0x18) + (int)poVar8);
  }
  else {
    sVar7 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  pcVar6 = local_2f8;
  local_2e8 = pcVar5;
  if (local_2f8 == (char *)0x0) {
    std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
  }
  else {
    sVar7 = strlen(local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar7);
  }
  pcVar5 = local_2e8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," inputValues[",0xd);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t",1);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar8 + -0x18) + (int)poVar8);
  }
  else {
    sVar7 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  pcVar6 = local_2f0;
  if (local_2f0 == (char *)0x0) {
    std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
  }
  else {
    sVar7 = strlen(local_2f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," outputValues[",0xe);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t",1);
  pcVar6 = "coherent ";
  pbVar13 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (AVar1 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    pcVar6 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,pcVar6,(ulong)(AVar1 == ATOMIC_OPERAND_BUFFER_VARIABLE) * 9);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar8 + -0x18) + (int)poVar8);
  }
  else {
    sVar7 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  pcVar6 = local_2f0;
  if (local_2f0 == (char *)0x0) {
    std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
  }
  else {
    sVar7 = strlen(local_2f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," groupValues[",0xd);
  lVar11 = 0;
  do {
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"} sb_inout;\n",0xc);
  if (AVar1 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"shared ",7);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)auStack_308 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x160);
    }
    else {
      sVar7 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    pcVar6 = local_2f8;
    if (local_2f8 == (char *)0x0) {
      std::ios::clear((int)auStack_308 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x160);
    }
    else {
      sVar7 = strlen(local_2f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," s_var;\n",8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\tuint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n",0x4d)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\tuint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
             ,0x84);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tuint globalOffs = localSize*globalNdx;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tuint offset     = globalOffs + gl_LocalInvocationIndex;\n",0x39
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  if (AVar1 == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tsb_inout.outputValues[offset] = ",0x21);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->m_funcName)._M_dataplus._M_p,
                        (this->m_funcName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"(sb_inout.groupValues[globalNdx], sb_inout.inputValues[offset]);\n",0x41);
  }
  else {
    DVar2 = this->m_type;
    if (local_300 == DVar2) {
      local_278._0_8_ = local_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,0x98644f);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_298,local_2f0,&local_2f9);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_298);
      local_278._0_8_ = local_268;
      pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar9 + 2);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9 == pbVar12) {
        local_268[0]._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
        local_268[0]._M_string_length = plVar9[3];
      }
      else {
        local_268[0]._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
        local_278._0_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9;
      }
      local_278._8_8_ = plVar9[1];
      *plVar9 = (long)pbVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
    }
    DVar3 = local_300;
    if ((local_300 != DVar2) && (local_298[0] != local_288)) {
      operator_delete(local_298[0],local_288[0] + 1);
    }
    DVar2 = this->m_type;
    if (DVar3 != DVar2) {
      pbVar13 = (bool *)0x983f86;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tif (gl_LocalInvocationIndex == 0u)\n",0x24);
    pcVar6 = local_2f8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t\ts_var = ",10);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_308 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x160);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
    local_2c0.value = (deUint64)this->m_initialValue;
    poVar8 = tcu::Format::Hex<8UL>::toStream(&local_2c0,(ostream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"u);\n",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tbarrier();\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t",1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," res = ",7);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(this->m_funcName)._M_dataplus._M_p,
                        (this->m_funcName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"(s_var, sb_inout.inputValues[offset]);\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\tsb_inout.outputValues[offset] = ",0x21);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_278._0_8_,local_278._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"res",3);
    uVar14 = (ulong)(local_300 != DVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pbVar13,uVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tbarrier();\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\tif (gl_LocalInvocationIndex == 0u)\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\t\tsb_inout.groupValues[globalNdx] = ",0x24);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_278._0_8_,local_278._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"s_var",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pbVar13,uVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_ !=
        local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268[0]._M_dataplus._M_p + 1));
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  pSVar10 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1c8[0x10] = 0;
  local_1c8._17_8_ = 0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8[8] = 0;
  local_1c8._9_7_ = 0;
  memset(local_278,0,0xac);
  std::__cxx11::stringbuf::str();
  local_2c0.value._0_4_ = 5;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_2e0,local_2d8 + (long)local_2e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_278 + (local_2c0.value & 0xffffffff) * 0x18),&local_2b8);
  glu::ShaderProgram::ShaderProgram(pSVar10,renderCtx,(ProgramSources *)local_278);
  this->m_program = pSVar10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0,local_2d0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1e8);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_278 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  pSVar10 = this->m_program;
  if ((pSVar10->m_program).m_info.linkOk != false) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    iVar4 = std::ios_base::~ios_base(local_138);
    return iVar4;
  }
  if (pSVar10 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar10);
    operator_delete(pSVar10,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_278._0_8_ = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Compile failed","");
  tcu::TestError::TestError(this_00,(string *)local_278);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderAtomicOpCase::init (void)
{
	const bool			isSSBO		= m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE;
	const char*			precName	= getPrecisionName(m_precision);
	const char*			typeName	= getDataTypeName(m_type);

	const DataType		outType		= isSSBO ? m_type : glu::TYPE_UINT;
	const char*			outTypeName	= getDataTypeName(outType);

	const deUint32		numValues	= product(m_workGroupSize)*product(m_numWorkGroups);
	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(getContextTypeGLSLVersion(m_context.getRenderContext().getType())) << "\n"
		<< "layout(local_size_x = " << m_workGroupSize.x()
		<< ", local_size_y = " << m_workGroupSize.y()
		<< ", local_size_z = " << m_workGroupSize.z() << ") in;\n"
		<< "layout(binding = 0) buffer InOut\n"
		<< "{\n"
		<< "	" << precName << " " << typeName << " inputValues[" << numValues << "];\n"
		<< "	" << precName << " " << outTypeName << " outputValues[" << numValues << "];\n"
		<< "	" << (isSSBO ? "coherent " : "") << precName << " " << outTypeName << " groupValues[" << product(m_numWorkGroups) << "];\n"
		<< "} sb_inout;\n";

	if (!isSSBO)
		src << "shared " << precName << " " << typeName << " s_var;\n";

	src << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "	uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		<< "	uint globalOffs = localSize*globalNdx;\n"
		<< "	uint offset     = globalOffs + gl_LocalInvocationIndex;\n"
		<< "\n";

	if (isSSBO)
	{
		DE_ASSERT(outType == m_type);
		src << "	sb_inout.outputValues[offset] = " << m_funcName << "(sb_inout.groupValues[globalNdx], sb_inout.inputValues[offset]);\n";
	}
	else
	{
		const string		castBeg	= outType != m_type ? (string(outTypeName) + "(") : string("");
		const char* const	castEnd	= outType != m_type ? ")" : "";

		src << "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		s_var = " << typeName << "(" << tcu::toHex(m_initialValue) << "u);\n"
			<< "	barrier();\n"
			<< "	" << precName << " " << typeName << " res = " << m_funcName << "(s_var, sb_inout.inputValues[offset]);\n"
			<< "	sb_inout.outputValues[offset] = " << castBeg << "res" << castEnd << ";\n"
			<< "	barrier();\n"
			<< "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		sb_inout.groupValues[globalNdx] = " << castBeg << "s_var" << castEnd << ";\n";
	}

	src << "}\n";

	DE_ASSERT(!m_program);
	m_program = new ShaderProgram(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}
}